

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::
SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnRenderTextureIfWindowNotCreated_Test::
TestBody(SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnRenderTextureIfWindowNotCreated_Test
         *this)

{
  bool bVar1;
  AssertHelper local_60;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  Message local_38 [4];
  TextureId local_14;
  
  local_58 = local_48;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_50 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_14.t = (anonymous_namespace)::textureId0;
    SDLGraphicsSystem::renderTexture
              (&(this->super_SDLGraphicsSystemAfterWindowCreationFailedTests).
                super_SDLGraphicsSystemTests.system,&local_14,
               (Position *)&(anonymous_namespace)::texturePosition,
               (Area *)(anonymous_namespace)::textureArea);
  }
  std::__cxx11::string::assign((char *)&local_58);
  testing::Message::Message(local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,199,local_58);
  testing::internal::AssertHelper::operator=(&local_60,local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (local_38[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemAfterWindowCreationFailedTests,
       throwOnRenderTextureIfWindowNotCreated)
{
    EXPECT_THROW(
        system.renderTexture(textureId0, texturePosition, textureArea),
        std::runtime_error
    );
}